

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase903::run(TestCase903 *this)

{
  __pid_t _Var1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char buf [4];
  OwnPromiseNode local_138;
  Array<char> local_130;
  uint local_114;
  DebugComparison<unsigned_int,_unsigned_long> _kjCondition;
  bool local_e0;
  Own<kj::Function<void_(kj::AsyncIoProvider_&,_kj::AsyncIoStream_&,_kj::WaitScope_&)>::Iface,_std::nullptr_t>
  local_90;
  PipeThread pipeThread;
  AsyncIoContext ioContext;
  unsigned_long uVar2;
  
  setupAsyncIo();
  local_90.ptr = (Iface *)operator_new(0x10);
  (local_90.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___00585470;
  local_90.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<void(kj::AsyncIoProvider&,kj::AsyncIoStream&,kj::WaitScope&)>::Impl<kj::(anonymous_namespace)::TestCase903::run()::$_0>>
        ::instance;
  (*(ioContext.provider.ptr)->_vptr_AsyncIoProvider[4])(&pipeThread,ioContext.provider.ptr);
  Own<kj::Function<void_(kj::AsyncIoProvider_&,_kj::AsyncIoStream_&,_kj::WaitScope_&)>::Iface,_std::nullptr_t>
  ::dispose(&local_90);
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  (**((pipeThread.pipe.ptr)->super_AsyncOutputStream)._vptr_AsyncOutputStream)
            (&_kjCondition,&(pipeThread.pipe.ptr)->super_AsyncOutputStream,&kj::_::ByteLiteral<4ul>,
             3);
  Promise<void>::wait((Promise<void> *)&_kjCondition,ioContext.waitScope);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&_kjCondition);
  (*((pipeThread.pipe.ptr)->super_AsyncInputStream)._vptr_AsyncInputStream[1])
            (&local_130,pipeThread.pipe.ptr,buf,3,4);
  _Var1 = Promise<unsigned_long>::wait((Promise<unsigned_long> *)&local_130,ioContext.waitScope);
  uVar2 = CONCAT44(extraout_var,_Var1);
  _kjCondition.result = uVar2 == 3;
  _kjCondition.left = 3;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.right = uVar2;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_130);
  if ((uVar2 != 3) && (kj::_::Debug::minSeverity < 3)) {
    local_114 = 3;
    (*((pipeThread.pipe.ptr)->super_AsyncInputStream)._vptr_AsyncInputStream[1])
              (&local_138,pipeThread.pipe.ptr,buf,3,4);
    _Var1 = Promise<unsigned_long>::wait((Promise<unsigned_long> *)&local_138,ioContext.waitScope);
    local_130.ptr = (char *)CONCAT44(extraout_var_00,_Var1);
    kj::_::Debug::
    log<char_const(&)[89],kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x397,ERROR,
               "\"failed: expected \" \"(3u) == (pipeThread.pipe->tryRead(buf, 3, 4).wait(ioContext.waitScope))\", _kjCondition, 3u, pipeThread.pipe->tryRead(buf, 3, 4).wait(ioContext.waitScope)"
               ,(char (*) [89])
                "failed: expected (3u) == (pipeThread.pipe->tryRead(buf, 3, 4).wait(ioContext.waitScope))"
               ,&_kjCondition,&local_114,(unsigned_long *)&local_130);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_138);
  }
  local_138.ptr = (PromiseNode *)0x423c58;
  heapString((String *)&local_130,buf,3);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_kj::String> *)&_kjCondition,
             (DebugExpression<char_const(&)[4]> *)&local_138,(String *)&local_130);
  Array<char>::~Array(&local_130);
  if ((local_e0 == false) && (kj::_::Debug::minSeverity < 3)) {
    heapString((String *)&local_130,buf,3);
    kj::_::Debug::
    log<char_const(&)[49],kj::_::DebugComparison<char_const(&)[4],kj::String>&,char_const(&)[4],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x398,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (heapString(buf, 3))\", _kjCondition, \"foo\", heapString(buf, 3)"
               ,(char (*) [49])"failed: expected (\"foo\") == (heapString(buf, 3))",
               (DebugComparison<const_char_(&)[4],_kj::String> *)&_kjCondition,
               (char (*) [4])0x423c58,(String *)&local_130);
    Array<char>::~Array(&local_130);
  }
  Array<char>::~Array((Array<char> *)&_kjCondition.right);
  AsyncIoProvider::PipeThread::~PipeThread(&pipeThread);
  AsyncIoContext::~AsyncIoContext(&ioContext);
  return;
}

Assistant:

TEST(AsyncIo, PipeThread) {
  auto ioContext = setupAsyncIo();

  auto pipeThread = ioContext.provider->newPipeThread(
      [](AsyncIoProvider& ioProvider, AsyncIoStream& stream, WaitScope& waitScope) {
    char buf[4]{};
    stream.write("foo"_kjb).wait(waitScope);
    EXPECT_EQ(3u, stream.tryRead(buf, 3, 4).wait(waitScope));
    EXPECT_EQ("bar", heapString(buf, 3));

    // Expect disconnect.
    EXPECT_EQ(0, stream.tryRead(buf, 1, 1).wait(waitScope));
  });

  char buf[4]{};
  pipeThread.pipe->write("bar"_kjb).wait(ioContext.waitScope);
  EXPECT_EQ(3u, pipeThread.pipe->tryRead(buf, 3, 4).wait(ioContext.waitScope));
  EXPECT_EQ("foo", heapString(buf, 3));
}